

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *this_00;
  bool bVar2;
  TargetType TVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string f;
  string dir;
  Names targetNames;
  string local_260;
  string local_240;
  string local_220;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  undefined1 *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  undefined1 *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined1 *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined1 *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined1 *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  undefined1 local_140 [32];
  _Alloc_hider local_120;
  undefined1 *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    return;
  }
  this_00 = this->LocalGenerator->GlobalGenerator;
  local_200 = &local_1f0;
  local_1f8 = 0;
  local_1f0 = 0;
  local_1e0 = &local_1d0;
  local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_1d0 = 0;
  local_1c0 = &local_1b0;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_1b0 = 0;
  local_1a0 = &local_190;
  local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_190 = 0;
  local_180 = &local_170;
  local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_170 = 0;
  local_160 = &local_150;
  local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_150 = 0;
  TVar3 = cmTarget::GetType(this->Target);
  if (TVar3 == EXECUTABLE) {
    GetExecutableNames((Names *)local_140,this,config);
  }
  else {
    TVar3 = cmTarget::GetType(this->Target);
    if (((TVar3 != STATIC_LIBRARY) &&
        (TVar3 = cmTarget::GetType(this->Target), TVar3 != SHARED_LIBRARY)) &&
       (TVar3 = cmTarget::GetType(this->Target), TVar3 != MODULE_LIBRARY)) goto LAB_004b00f1;
    GetLibraryNames((Names *)local_140,this,config);
  }
  std::__cxx11::string::operator=((string *)&local_200,(string *)local_140);
  std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_120);
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_100);
  std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_c0);
  std::__cxx11::string::operator=((string *)&local_160,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != &local_d0) {
    operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_p != &local_f0) {
    operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_p != &local_110) {
    operator_delete(local_120._M_p,local_110._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  GetDirectory(&local_220,this,config,RuntimeBinaryArtifact);
  paVar1 = &local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  local_240._M_dataplus._M_p = (pointer)paVar1;
  if (local_1d8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_140._24_8_ = local_50;
    local_60 = 1;
    local_50[0] = 0x2f;
    local_140._0_8_ = local_220._M_string_length;
    local_140._8_8_ = local_220._M_dataplus._M_p;
    local_140._16_8_ = 1;
    local_120._M_p = (pointer)local_1d8;
    local_118 = local_1e0;
    views._M_len = 3;
    views._M_array = (iterator)local_140;
    local_58 = (undefined1 *)local_140._24_8_;
    cmCatViews_abi_cxx11_(&local_260,views);
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    cmGlobalGenerator::AddToManifest(this_00,&local_240);
  }
  if (local_158 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_140._24_8_ = local_50;
    local_60 = 1;
    local_50[0] = 0x2f;
    local_140._0_8_ = local_220._M_string_length;
    local_140._8_8_ = local_220._M_dataplus._M_p;
    local_140._16_8_ = 1;
    local_120._M_p = (pointer)local_158;
    local_118 = local_160;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_140;
    local_58 = (undefined1 *)local_140._24_8_;
    cmCatViews_abi_cxx11_(&local_260,views_00);
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    cmGlobalGenerator::AddToManifest(this_00,&local_240);
  }
  if (local_1b8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_140._24_8_ = local_50;
    local_60 = 1;
    local_50[0] = 0x2f;
    local_140._0_8_ = local_220._M_string_length;
    local_140._8_8_ = local_220._M_dataplus._M_p;
    local_140._16_8_ = 1;
    local_120._M_p = (pointer)local_1b8;
    local_118 = local_1c0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_140;
    local_58 = (undefined1 *)local_140._24_8_;
    cmCatViews_abi_cxx11_(&local_260,views_01);
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    cmGlobalGenerator::AddToManifest(this_00,&local_240);
  }
  if (local_178 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_140._24_8_ = local_50;
    local_60 = 1;
    local_50[0] = 0x2f;
    local_140._0_8_ = local_220._M_string_length;
    local_140._8_8_ = local_220._M_dataplus._M_p;
    local_140._16_8_ = 1;
    local_120._M_p = (pointer)local_178;
    local_118 = local_180;
    views_02._M_len = 3;
    views_02._M_array = (iterator)local_140;
    local_58 = (undefined1 *)local_140._24_8_;
    cmCatViews_abi_cxx11_(&local_260,views_02);
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    cmGlobalGenerator::AddToManifest(this_00,&local_240);
  }
  if (local_198 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    GetDirectory(&local_80,this,config,ImportLibraryArtifact);
    local_140._24_8_ = local_50;
    local_60 = 1;
    local_50[0] = 0x2f;
    local_140._0_8_ = local_80._M_string_length;
    local_140._8_8_ = local_80._M_dataplus._M_p;
    local_140._16_8_ = 1;
    local_120._M_p = (pointer)local_198;
    local_118 = local_1a0;
    views_03._M_len = 3;
    views_03._M_array = (iterator)local_140;
    local_58 = (undefined1 *)local_140._24_8_;
    cmCatViews_abi_cxx11_(&local_260,views_03);
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    cmGlobalGenerator::AddToManifest(this_00,&local_240);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar1) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                             local_240.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
LAB_004b00f1:
  if (local_160 != &local_150) {
    operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeTargetManifest(const std::string& config) const
{
  if (this->IsImported()) {
    return;
  }
  cmGlobalGenerator* gg = this->LocalGenerator->GetGlobalGenerator();

  // Get the names.
  cmGeneratorTarget::Names targetNames;
  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    targetNames = this->GetExecutableNames(config);
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames = this->GetLibraryNames(config);
  } else {
    return;
  }

  // Get the directory.
  std::string dir =
    this->GetDirectory(config, cmStateEnums::RuntimeBinaryArtifact);

  // Add each name.
  std::string f;
  if (!targetNames.Output.empty()) {
    f = cmStrCat(dir, '/', targetNames.Output);
    gg->AddToManifest(f);
  }
  if (!targetNames.SharedObject.empty()) {
    f = cmStrCat(dir, '/', targetNames.SharedObject);
    gg->AddToManifest(f);
  }
  if (!targetNames.Real.empty()) {
    f = cmStrCat(dir, '/', targetNames.Real);
    gg->AddToManifest(f);
  }
  if (!targetNames.PDB.empty()) {
    f = cmStrCat(dir, '/', targetNames.PDB);
    gg->AddToManifest(f);
  }
  if (!targetNames.ImportLibrary.empty()) {
    f =
      cmStrCat(this->GetDirectory(config, cmStateEnums::ImportLibraryArtifact),
               '/', targetNames.ImportLibrary);
    gg->AddToManifest(f);
  }
}